

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O2

void MpiReleaseTimeStep(CP_Services Svcs,DP_WS_Stream Stream_v,size_t TimeStep)

{
  pthread_rwlock_t *__rwlock;
  size_t sVar1;
  size_t *psVar2;
  size_t *psVar3;
  size_t *psVar4;
  
  (*Svcs->verbose)(*Stream_v,5,"Releasing timestep %ld\n",TimeStep);
  __rwlock = (pthread_rwlock_t *)((long)Stream_v + 0x40);
  pthread_rwlock_rdlock(__rwlock);
  psVar3 = (size_t *)((long)Stream_v + 0x20);
  psVar4 = *(size_t **)((long)Stream_v + 0x20);
  pthread_rwlock_unlock(__rwlock);
  if ((psVar4 == (size_t *)0x0) || (*psVar4 != TimeStep)) {
    pthread_rwlock_rdlock(__rwlock);
    psVar4 = psVar3;
    while( true ) {
      psVar4 = (size_t *)*psVar4;
      if (psVar4 == (size_t *)0x0) {
        pthread_rwlock_unlock(__rwlock);
        return;
      }
      if (*psVar4 == TimeStep) break;
      psVar4 = psVar4 + 2;
    }
    pthread_rwlock_unlock(__rwlock);
    pthread_rwlock_wrlock(__rwlock);
    psVar2 = (size_t *)*psVar3;
    if (psVar2 == psVar4) goto LAB_00120670;
    do {
      psVar3 = psVar2;
      psVar2 = (size_t *)psVar3[2];
    } while (psVar2 != psVar4);
    sVar1 = psVar2[2];
    psVar3[2] = sVar1;
    if (sVar1 != 0) goto LAB_00120681;
    psVar3 = psVar3 + 2;
  }
  else {
    pthread_rwlock_wrlock(__rwlock);
    psVar2 = (size_t *)*psVar3;
LAB_00120670:
    sVar1 = psVar2[2];
    *psVar3 = sVar1;
    if (sVar1 != 0) goto LAB_00120681;
  }
  *(size_t **)((long)Stream_v + 0x28) = psVar3;
LAB_00120681:
  pthread_rwlock_unlock(__rwlock);
  free((void *)psVar4[1]);
  free(psVar4);
  return;
}

Assistant:

static void MpiReleaseTimeStep(CP_Services Svcs, DP_WS_Stream Stream_v, size_t TimeStep)
{
    MpiStreamWR Stream = (MpiStreamWR)Stream_v;

    Svcs->verbose(Stream->Stream.CP_Stream, DPTraceVerbose, "Releasing timestep %ld\n", TimeStep);

    pthread_rwlock_rdlock(&Stream->LockTS);
    TimeStepsEntry EntryToDelete = STAILQ_FIRST(&Stream->TimeSteps);
    pthread_rwlock_unlock(&Stream->LockTS);

    // Optimal pathway
    if (EntryToDelete && EntryToDelete->TimeStep == TimeStep)
    {
        pthread_rwlock_wrlock(&Stream->LockTS);
        STAILQ_REMOVE_HEAD(&Stream->TimeSteps, entries);
        pthread_rwlock_unlock(&Stream->LockTS);
    }
    else // General pathway
    {
        EntryToDelete = NULL;

        pthread_rwlock_rdlock(&Stream->LockTS);
        STAILQ_FOREACH(EntryToDelete, &Stream->TimeSteps, entries)
        {
            if (EntryToDelete->TimeStep == TimeStep)
            {
                break;
            }
        }
        pthread_rwlock_unlock(&Stream->LockTS);
        if (EntryToDelete)
        {
            pthread_rwlock_wrlock(&Stream->LockTS);
            STAILQ_REMOVE(&Stream->TimeSteps, EntryToDelete, _TimeStepsEntry, entries);
            pthread_rwlock_unlock(&Stream->LockTS);
        }
    }

    if (EntryToDelete)
    {
        free(EntryToDelete->Data);
        free(EntryToDelete);
    }
}